

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_relaxng(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  FILE *pFVar14;
  xmlDocPtr pxVar15;
  undefined8 uVar16;
  xmlDocPtr pxVar17;
  xmlDocPtr val;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int n_doc;
  uint uVar18;
  ulong uVar19;
  xmlNodePtr pxVar20;
  int n_elem;
  undefined8 *puVar21;
  undefined4 *puVar22;
  int test_ret_2;
  char *pcVar23;
  int test_ret;
  int iVar24;
  uint *puVar25;
  int n_size;
  uint uVar26;
  int *piVar27;
  int test_ret_1;
  int test_ret_6;
  int test_ret_3;
  int test_ret_4;
  int test_ret_5;
  int local_48;
  int local_44;
  uint local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing relaxng : 14 of 25 functions ...");
  }
  iVar24 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    iVar3 = xmlMemBlocks();
    if (bVar1) {
      pFVar14 = fopen64("test.out","a+");
    }
    else {
      pFVar14 = (FILE *)0x0;
    }
    xmlRelaxNGDump(pFVar14);
    call_tests = call_tests + 1;
    if (pFVar14 != (FILE *)0x0) {
      fclose(pFVar14);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDump",(ulong)(uint)(iVar4 - iVar3));
      iVar24 = iVar24 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  local_48 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    iVar3 = xmlMemBlocks();
    if (bVar1) {
      pFVar14 = fopen64("test.out","a+");
    }
    else {
      pFVar14 = (FILE *)0x0;
    }
    xmlRelaxNGDumpTree(pFVar14);
    call_tests = call_tests + 1;
    if (pFVar14 != (FILE *)0x0) {
      fclose(pFVar14);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDumpTree",(ulong)(uint)(iVar4 - iVar3));
      local_48 = local_48 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlRelaxNGGetParserErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  iVar24 = local_48 + iVar24;
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  uVar19 = 0;
  xmlRelaxNGGetValidErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetValidErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    uVar19 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlRelaxNGInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    uVar19 = (ulong)(uint)(iVar9 - iVar7);
    printf("Leak of %d blocks found in xmlRelaxNGInitTypes");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar18 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    pxVar15 = gen_xmlDocPtr(uVar18,(int)uVar19);
    uVar16 = xmlRelaxNGNewDocParserCtxt(pxVar15);
    xmlRelaxNGFreeParserCtxt(uVar16);
    call_tests = call_tests + 1;
    if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
      xmlFreeDoc(pxVar15);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewDocParserCtxt",(ulong)(uint)(iVar11 - iVar10))
      ;
      iVar9 = iVar9 + 1;
      uVar19 = (ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  local_40 = (uint)(iVar7 != iVar8);
  uVar18 = 0;
  iVar7 = 0;
  do {
    puVar25 = &DAT_00158164;
    pxVar15 = (xmlDocPtr)0x0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar18 == 0) {
        bVar2 = false;
        pcVar23 = "foo";
      }
      else if (uVar18 == 2) {
        bVar2 = false;
        pcVar23 = "test/ent2";
      }
      else if (uVar18 == 1) {
        bVar2 = false;
        pcVar23 = "<foo/>";
      }
      else {
        bVar2 = true;
        pcVar23 = (char *)0x0;
      }
      uVar26 = *puVar25;
      if ((!bVar2) && (iVar10 = xmlStrlen(pcVar23), iVar10 < (int)uVar26)) {
        uVar26 = 0;
      }
      val = (xmlDocPtr)(ulong)uVar26;
      uVar16 = xmlRelaxNGNewMemParserCtxt(pcVar23);
      xmlRelaxNGFreeParserCtxt(uVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      iVar11 = (int)pxVar15;
      if (iVar8 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGNewMemParserCtxt",(ulong)(uint)(iVar10 - iVar8)
              );
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar15;
      }
      uVar26 = iVar11 + 1;
      pxVar15 = (xmlDocPtr)(ulong)uVar26;
      puVar25 = puVar25 + 1;
    } while (uVar26 != 4);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  puVar21 = &DAT_0015ad48;
  uVar18 = 0;
  local_38 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar18 < 3) {
      uVar16 = *puVar21;
    }
    else {
      uVar16 = 0;
    }
    xmlRelaxNGNewParserCtxt(uVar16);
    xmlRelaxNGFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewParserCtxt",(ulong)(uint)(iVar10 - iVar8));
      local_38 = local_38 + 1;
      val = (xmlDocPtr)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar21 = puVar21 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  uVar18 = 0;
  local_34 = 0;
  do {
    iVar10 = (int)val;
    iVar8 = xmlMemBlocks();
    pxVar15 = gen_xmlDocPtr(uVar18,iVar10);
    val = pxVar15;
    xmlRelaxNGValidateDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
      xmlFreeDoc(pxVar15);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar8 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGValidateDoc",(ulong)(uint)(iVar10 - iVar8));
      local_34 = local_34 + 1;
      printf(" %d",0);
      val = (xmlDocPtr)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar18 = 0;
  do {
    pxVar15 = (xmlDocPtr)0x0;
    do {
      iVar8 = (int)val;
      iVar10 = xmlMemBlocks();
      pxVar17 = gen_xmlDocPtr(uVar18,iVar8);
      iVar11 = (int)pxVar15;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar11,iVar8);
      xmlRelaxNGValidateFullElement(0,pxVar17,val);
      call_tests = call_tests + 1;
      iVar8 = extraout_EDX;
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
        iVar8 = extraout_EDX_00;
      }
      des_xmlNodePtr(iVar11,(xmlNodePtr)val,iVar8);
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar10 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidateFullElement",
               (ulong)(uint)(iVar8 - iVar10));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar15;
      }
      pxVar15 = (xmlDocPtr)(ulong)(iVar11 + 1U);
    } while (iVar11 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar18 = 0;
  do {
    pxVar15 = (xmlDocPtr)0x0;
    do {
      iVar10 = (int)val;
      iVar11 = xmlMemBlocks();
      pxVar17 = gen_xmlDocPtr(uVar18,iVar10);
      iVar12 = (int)pxVar15;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar12,iVar10);
      xmlRelaxNGValidatePopElement(0,pxVar17,val);
      call_tests = call_tests + 1;
      iVar10 = extraout_EDX_01;
      if (((pxVar17 != (xmlDocPtr)0x0) && (api_doc != pxVar17)) && (pxVar17->doc != api_doc)) {
        xmlFreeDoc(pxVar17);
        iVar10 = extraout_EDX_02;
      }
      des_xmlNodePtr(iVar12,(xmlNodePtr)val,iVar10);
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar11 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePopElement",
               (ulong)(uint)(iVar10 - iVar11));
        iVar8 = iVar8 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        val = pxVar15;
      }
      pxVar15 = (xmlDocPtr)(ulong)(iVar12 + 1U);
    } while (iVar12 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  uVar18 = 0;
  local_48 = 0;
  do {
    piVar27 = &DAT_00158164;
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar10 = xmlMemBlocks();
      switch(uVar18) {
      case 0:
        bVar2 = false;
        pcVar23 = "foo";
        break;
      case 1:
        bVar2 = false;
        pcVar23 = "<foo/>";
        break;
      case 2:
        bVar2 = false;
        pcVar23 = anon_var_dwarf_194;
        break;
      case 3:
        bVar2 = false;
        pcVar23 = " 2ab ";
        break;
      default:
        bVar2 = true;
        pcVar23 = (char *)0x0;
      }
      iVar11 = *piVar27;
      if ((!bVar2) && (iVar12 = xmlStrlen(pcVar23), iVar12 < iVar11)) {
        iVar11 = 0;
      }
      xmlRelaxNGValidatePushCData(0,pcVar23,iVar11);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      iVar12 = (int)pxVar20;
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
               (ulong)(uint)(iVar11 - iVar10));
        local_48 = local_48 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        pcVar23 = (char *)pxVar20;
      }
      uVar26 = iVar12 + 1;
      pxVar20 = (xmlNodePtr)(ulong)uVar26;
      piVar27 = piVar27 + 1;
    } while (uVar26 != 4);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar18 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar11 = (int)pcVar23;
      iVar12 = xmlMemBlocks();
      pxVar15 = gen_xmlDocPtr(uVar18,iVar11);
      iVar13 = (int)pxVar20;
      pcVar23 = (char *)gen_xmlNodePtr(iVar13,iVar11);
      xmlRelaxNGValidatePushElement(0,pxVar15,pcVar23);
      call_tests = call_tests + 1;
      iVar11 = extraout_EDX_03;
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc(pxVar15);
        iVar11 = extraout_EDX_04;
      }
      des_xmlNodePtr(iVar13,(xmlNodePtr)pcVar23,iVar11);
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar12 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
               (ulong)(uint)(iVar11 - iVar12));
        iVar10 = iVar10 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        pcVar23 = (char *)pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar13 + 1U);
    } while (iVar13 + 1U != 3);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  puVar22 = &DAT_00158164;
  uVar18 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    xmlRelaxParserSetFlag(0,*puVar22);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxParserSetFlag",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar18);
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  uVar18 = local_44 + iVar8 +
           iVar24 + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) + local_40 + iVar9 + iVar7 +
           local_38 + local_34 + local_48 + iVar10 + iVar11;
  if (uVar18 != 0) {
    printf("Module relaxng: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 25 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetResourceLoader();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}